

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

int __thiscall efsw::String::compare(String *this,size_t pos1,size_t n1,char *s,size_t n2)

{
  int iVar1;
  String local_50;
  size_t local_30;
  size_t n2_local;
  char *s_local;
  size_t n1_local;
  size_t pos1_local;
  String *this_local;
  
  local_30 = n2;
  n2_local = (size_t)s;
  s_local = (char *)n1;
  n1_local = pos1;
  pos1_local = (size_t)this;
  String(&local_50,s);
  iVar1 = compare(this,pos1,n1,&local_50,0,local_30);
  ~String(&local_50);
  return iVar1;
}

Assistant:

int String::compare( std::size_t pos1, std::size_t n1, const char* s, std::size_t n2 ) const {
	return compare( pos1, n1, String( s ), 0, n2 );
}